

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O1

size_t CBB_get_utf8_len(uint32_t u)

{
  size_t sVar1;
  
  sVar1 = 1;
  if ((0x7f < u) && (sVar1 = 2, 0x7ff < u)) {
    sVar1 = 4 - (ulong)(u < 0x10000);
  }
  return sVar1;
}

Assistant:

size_t CBB_get_utf8_len(uint32_t u) {
  if (u <= 0x7f) {
    return 1;
  }
  if (u <= 0x7ff) {
    return 2;
  }
  if (u <= 0xffff) {
    return 3;
  }
  return 4;
}